

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_bit.cpp
# Opt level: O3

ssize_t cornelich::util::stop_bit::read(int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  ulong uVar2;
  logic_error *this;
  byte bVar3;
  ulong uVar4;
  long lVar6;
  undefined4 in_register_0000003c;
  long lVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar5;
  
  lVar7 = CONCAT44(in_register_0000003c,__fd);
  iVar9 = *__buf;
  lVar6 = (long)iVar9 + 1;
  *(int *)__buf = (int)lVar6;
  cVar1 = *(char *)(lVar7 + iVar9);
  if (-1 < (long)cVar1) {
    return (long)cVar1;
  }
  uVar2 = (ulong)((int)cVar1 & 0x7f);
  *(int *)__buf = iVar9 + 2;
  cVar1 = *(char *)(lVar7 + lVar6);
  lVar6 = (long)cVar1;
  if (-1 < lVar6) {
    bVar3 = 7;
    if (cVar1 != '\0') {
LAB_0010faff:
      return uVar2 | lVar6 << (bVar3 & 0x3f);
    }
LAB_0010fb0d:
    return ~uVar2;
  }
  pcVar8 = (char *)(lVar7 + (iVar9 + 2));
  iVar9 = iVar9 + 3;
  uVar4 = 0;
  do {
    uVar5 = uVar4;
    uVar4 = uVar5 + 7;
    uVar2 = uVar2 | (ulong)((uint)lVar6 & 0x7f) << ((byte)uVar4 & 0x3f);
    *(int *)__buf = iVar9;
    cVar1 = *pcVar8;
    lVar6 = (long)cVar1;
    pcVar8 = pcVar8 + 1;
    iVar9 = iVar9 + 1;
  } while (lVar6 < 0);
  if (cVar1 == '\0') {
    if (uVar4 < 0x39) goto LAB_0010fb0d;
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Cannot read more than 10 stop bits of negative value");
  }
  else {
    if (uVar4 < 0x32) {
      bVar3 = (char)uVar5 + 0xe;
      goto LAB_0010faff;
    }
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Cannot read more than 9 stop bits of positive value");
  }
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::int64_t read(const std::uint8_t * buffer, std::int32_t & offset)
{
    std::int64_t l;
    if ((l = (std::int8_t)buffer[offset++]) >= 0)
        return l;
    l &= 0x7FL;
    std::int64_t b;
    int count = 7;
    while ((b = (std::int8_t)buffer[offset++]) < 0)
    {
        l |= (b & 0x7FL) << count;
        count += 7;
    }
    if (b != 0)
    {
        if (count > 56)
            throw std::logic_error("Cannot read more than 9 stop bits of positive value");
        return l | (b << count);
    }
    else
    {
        if (count > 63)
            throw std::logic_error("Cannot read more than 10 stop bits of negative value");
        return ~l;
    }
}